

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricGroupGetGlobalTimestampsExp
          (zet_metric_group_handle_t hMetricGroup,ze_bool_t synchronizedWithHost,
          uint64_t *globalTimestamp,uint64_t *metricTimestamp)

{
  zet_pfnMetricGroupGetGlobalTimestampsExp_t pfnGetGlobalTimestampsExp;
  ze_result_t result;
  uint64_t *metricTimestamp_local;
  uint64_t *globalTimestamp_local;
  ze_bool_t synchronizedWithHost_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  pfnGetGlobalTimestampsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8a8 != (code *)0x0) {
    pfnGetGlobalTimestampsExp._4_4_ =
         (*DAT_0011c8a8)(hMetricGroup,synchronizedWithHost,globalTimestamp,metricTimestamp);
  }
  return pfnGetGlobalTimestampsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupGetGlobalTimestampsExp(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        ze_bool_t synchronizedWithHost,                 ///< [in] Returns the timestamps synchronized to the host or the device.
        uint64_t* globalTimestamp,                      ///< [out] Device timestamp.
        uint64_t* metricTimestamp                       ///< [out] Metric timestamp.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetGlobalTimestampsExp = context.zetDdiTable.MetricGroupExp.pfnGetGlobalTimestampsExp;
        if( nullptr != pfnGetGlobalTimestampsExp )
        {
            result = pfnGetGlobalTimestampsExp( hMetricGroup, synchronizedWithHost, globalTimestamp, metricTimestamp );
        }
        else
        {
            // generic implementation
        }

        return result;
    }